

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

time_t Curl_timeleft(Curl_easy *data,timeval *nowp,_Bool duringconnect)

{
  byte bVar1;
  int iVar2;
  time_t tVar3;
  timeval tVar4;
  __time_t local_50;
  __suseconds_t local_48;
  undefined1 local_40 [8];
  timeval now;
  time_t timeout_ms;
  int timeout_set;
  _Bool duringconnect_local;
  timeval *nowp_local;
  Curl_easy *data_local;
  
  iVar2 = 0;
  if (duringconnect) {
    iVar2 = 300000;
  }
  now.tv_usec = (__suseconds_t)iVar2;
  bVar1 = 0 < (data->set).timeout;
  if ((duringconnect) && (0 < (data->set).connecttimeout)) {
    bVar1 = bVar1 | 2;
  }
  if (bVar1 == 1) {
    now.tv_usec = (data->set).timeout;
  }
  else if (bVar1 == 2) {
    now.tv_usec = (data->set).connecttimeout;
  }
  else if (bVar1 == 3) {
    if ((data->set).timeout < (data->set).connecttimeout) {
      now.tv_usec = (data->set).timeout;
    }
    else {
      now.tv_usec = (data->set).connecttimeout;
    }
  }
  else if (!duringconnect) {
    return 0;
  }
  _timeout_set = nowp;
  if (nowp == (timeval *)0x0) {
    tVar4 = curlx_tvnow();
    local_50 = tVar4.tv_sec;
    local_40 = (undefined1  [8])local_50;
    local_48 = tVar4.tv_usec;
    now.tv_sec = local_48;
    _timeout_set = (timeval *)local_40;
  }
  if (duringconnect) {
    tVar3 = curlx_tvdiff(*_timeout_set,(data->progress).t_startsingle);
    now.tv_usec = now.tv_usec - tVar3;
  }
  else {
    tVar3 = curlx_tvdiff(*_timeout_set,(data->progress).t_startop);
    now.tv_usec = now.tv_usec - tVar3;
  }
  if (now.tv_usec == 0) {
    data_local = (Curl_easy *)0xffffffffffffffff;
  }
  else {
    data_local = (Curl_easy *)now.tv_usec;
  }
  return (time_t)data_local;
}

Assistant:

time_t Curl_timeleft(struct Curl_easy *data,
                     struct timeval *nowp,
                     bool duringconnect)
{
  int timeout_set = 0;
  time_t timeout_ms = duringconnect?DEFAULT_CONNECT_TIMEOUT:0;
  struct timeval now;

  /* if a timeout is set, use the most restrictive one */

  if(data->set.timeout > 0)
    timeout_set |= 1;
  if(duringconnect && (data->set.connecttimeout > 0))
    timeout_set |= 2;

  switch(timeout_set) {
  case 1:
    timeout_ms = data->set.timeout;
    break;
  case 2:
    timeout_ms = data->set.connecttimeout;
    break;
  case 3:
    if(data->set.timeout < data->set.connecttimeout)
      timeout_ms = data->set.timeout;
    else
      timeout_ms = data->set.connecttimeout;
    break;
  default:
    /* use the default */
    if(!duringconnect)
      /* if we're not during connect, there's no default timeout so if we're
         at zero we better just return zero and not make it a negative number
         by the math below */
      return 0;
    break;
  }

  if(!nowp) {
    now = Curl_tvnow();
    nowp = &now;
  }

  /* subtract elapsed time */
  if(duringconnect)
    /* since this most recent connect started */
    timeout_ms -= Curl_tvdiff(*nowp, data->progress.t_startsingle);
  else
    /* since the entire operation started */
    timeout_ms -= Curl_tvdiff(*nowp, data->progress.t_startop);
  if(!timeout_ms)
    /* avoid returning 0 as that means no timeout! */
    return -1;

  return timeout_ms;
}